

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  undefined1 *puVar1;
  ptls_esni_secret_t **esni;
  uint8_t *puVar2;
  byte bVar3;
  uint16_t uVar4;
  ushort uVar5;
  st_ptls_update_esni_key_t *psVar6;
  size_t *psVar7;
  ptls_context_t *ppVar8;
  _func_void_void_ptr_size_t *p_Var9;
  ptls_buffer_t *buf;
  st_ptls_key_exchange_algorithm_t *psVar10;
  ptls_iovec_t *ppVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ptls_iovec_t hash_value;
  ptls_iovec_t pVar15;
  int iVar16;
  ptls_early_data_acceptance_t pVar17;
  uint uVar18;
  int iVar19;
  ptls_esni_secret_t *ppVar20;
  ptls_cipher_suite_t **pppVar21;
  ptls_hash_context_t *ppVar22;
  ptls_key_schedule_t *sched;
  uint64_t uVar23;
  long lVar24;
  size_t sVar25;
  ptls_cipher_suite_t *ppVar26;
  ptls_hash_context_t **pppVar27;
  size_t sVar28;
  uint16_t in_R8W;
  uint uVar29;
  ulong uVar30;
  ptls_hash_algorithm_t *ppVar31;
  ptls_cipher_suite_t *in_R9;
  ptls_cipher_suite_t *ppVar32;
  undefined1 *puVar33;
  long lVar34;
  long lVar35;
  ptls_key_exchange_algorithm_t *ppVar36;
  ulong uVar37;
  uint16_t *puVar38;
  undefined8 unaff_R14;
  size_t sVar39;
  ptls_cipher_suite_t *ppVar40;
  ptls_key_schedule_t *ppVar41;
  ulong uVar42;
  ptls_key_exchange_algorithm_t **pppVar43;
  bool bVar44;
  bool bVar45;
  ptls_iovec_t secret;
  ptls_iovec_t ikm;
  ptls_iovec_t esni_keys;
  uint16_t _v;
  uint32_t _v_1;
  uint64_t not_after;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_iovec_t resumption_ticket;
  uint32_t lifetime;
  uint8_t binder_key [64];
  uint8_t *in_stack_fffffffffffffeb8;
  uint8_t *puVar46;
  char *local_110;
  ptls_cipher_suite_t *local_108;
  size_t sStack_100;
  ptls_cipher_suite_t *local_f8;
  ptls_key_exchange_algorithm_t **local_f0;
  ptls_key_schedule_t *local_e8;
  ptls_handshake_properties_t *local_e0;
  ptls_cipher_suite_t *local_d8;
  ptls_context_t *local_d0;
  size_t local_c8;
  ptls_iovec_t *local_c0;
  char *local_b8;
  ulong local_b0;
  uint local_a8;
  uint32_t local_a4;
  long local_a0;
  ptls_iovec_t local_98;
  size_t local_88;
  uint32_t local_7c;
  ptls_iovec_t local_78 [4];
  
  ppVar41 = tls->key_schedule;
  ppVar26 = (ptls_cipher_suite_t *)0x0;
  local_c0 = cookie;
  if (tls->server_name == (char *)0x0) {
    local_f0 = (ptls_key_exchange_algorithm_t **)0x0;
  }
  else {
    iVar16 = ptls_server_name_is_ipaddr(tls->server_name);
    local_f0 = (ptls_key_exchange_algorithm_t **)CONCAT71((int7)((ulong)unaff_R14 >> 8),iVar16 == 0)
    ;
  }
  local_e0 = properties;
  if (properties == (ptls_handshake_properties_t *)0x0) {
    local_110 = (char *)0x0;
    uVar30 = 0;
    local_f8 = (ptls_cipher_suite_t *)0x0;
  }
  else {
    if (((ppVar41 == (ptls_key_schedule_t *)0x0 & (byte)local_f0) == 1) &&
       (ppVar26 = (ptls_cipher_suite_t *)(properties->field_0).client.esni_keys.base,
       ppVar26 != (ptls_cipher_suite_t *)0x0)) {
      local_d0 = tls->ctx;
      sVar39 = (properties->field_0).client.esni_keys.len;
      local_f8 = ppVar26;
      ppVar20 = (ptls_esni_secret_t *)malloc(0xd0);
      tls->esni = ppVar20;
      if (ppVar20 == (ptls_esni_secret_t *)0x0) {
        iVar16 = 0x201;
        local_110 = (char *)0x0;
      }
      else {
        memset(ppVar20,0,0xd0);
        ppVar26 = local_f8;
        local_108 = local_f8;
        if (((long)sVar39 < 2) ||
           (puVar33 = &local_f8->field_0x2, local_108 = (ptls_cipher_suite_t *)puVar33,
           (uint16_t)(local_f8->id << 8 | local_f8->id >> 8) != 0xff02)) {
          uVar30 = 0x32;
          local_110 = (char *)0x0;
        }
        else {
          local_d8 = (ptls_cipher_suite_t *)((long)&local_f8->id + sVar39);
          uVar30 = 0x32;
          local_e8 = ppVar41;
          if ((long)local_d8 - (long)puVar33 < 4) {
LAB_00114248:
            bVar45 = false;
          }
          else {
            pppVar21 = local_d0->cipher_suites;
            ppVar40 = *pppVar21;
            if (ppVar40 == (ptls_cipher_suite_t *)0x0) {
              ppVar22 = (st_ptls_hash_context_t *)0x0;
            }
            else {
              ppVar22 = (st_ptls_hash_context_t *)0x0;
              do {
                pppVar21 = pppVar21 + 1;
                if ((ppVar40->id | 2) == 0x1303) {
                  ppVar22 = (*ppVar40->hash->create)();
                  break;
                }
                ppVar40 = *pppVar21;
              } while (ppVar40 != (ptls_cipher_suite_t *)0x0);
            }
            if (ppVar22 == (st_ptls_hash_context_t *)0x0) {
              uVar30 = 0x203;
              goto LAB_00114248;
            }
            (*ppVar22->update)(ppVar22,local_f8,(long)puVar33 - (long)local_f8);
            (*ppVar22->update)(ppVar22,"",4);
            puVar1 = &ppVar26->field_0x6;
            (*ppVar22->update)(ppVar22,puVar1,(long)local_d8 - (long)puVar1);
            bVar45 = false;
            (*ppVar22->final)(ppVar22,local_78,PTLS_HASH_FINAL_MODE_FREE);
            uVar30 = 0x32;
            if (*(int *)puVar33 == (int)local_78[0].base) {
              bVar45 = true;
              uVar30 = 0;
              local_108 = (ptls_cipher_suite_t *)puVar1;
            }
          }
          if (bVar45) {
            ppVar20->version = 0xff02;
            uVar18 = 0x32;
            if ((ulong)((long)local_d8 - (long)local_108) < 2) {
LAB_001142a4:
              local_110 = (char *)0x0;
              bVar45 = false;
            }
            else {
              lVar24 = 0;
              uVar42 = 0;
              do {
                uVar42 = (ulong)*(uint8_t *)((long)&local_108->id + lVar24) | uVar42 << 8;
                lVar24 = lVar24 + 1;
              } while (lVar24 != 2);
              puVar33 = &local_108->field_0x2;
              local_108 = (ptls_cipher_suite_t *)puVar33;
              if ((ulong)((long)local_d8 - (long)puVar33) < uVar42) goto LAB_001142a4;
              uVar29 = (uint)uVar30;
              ppVar26 = (ptls_cipher_suite_t *)(puVar33 + uVar42);
              local_110 = (char *)malloc(uVar42 + 1);
              if (local_110 == (char *)0x0) {
                uVar29 = 0x201;
              }
              else {
                if (uVar42 != 0) {
                  memcpy(local_110,puVar33,uVar42);
                }
                local_110[uVar42] = '\0';
                local_108 = ppVar26;
              }
              uVar18 = 0x32;
              if (local_108 == ppVar26) {
                uVar18 = uVar29;
              }
              if (local_110 == (char *)0x0) {
                uVar18 = uVar29;
              }
              bVar45 = local_110 != (char *)0x0 && local_108 == ppVar26;
            }
            ppVar41 = local_e8;
            if (bVar45) {
              uVar30 = 0x32;
              if ((ulong)((long)local_d8 - (long)local_108) < 2) {
                uVar37 = 0;
              }
              else {
                lVar24 = 0;
                uVar42 = 0;
                do {
                  uVar42 = (ulong)*(uint8_t *)((long)&local_108->id + lVar24) | uVar42 << 8;
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 2);
                local_108 = (ptls_cipher_suite_t *)&local_108->field_0x2;
                uVar37 = 0;
                if (uVar42 <= (ulong)((long)local_d8 - (long)local_108)) {
                  ppVar26 = (ptls_cipher_suite_t *)((long)local_108 + uVar42);
                  in_R9 = (ptls_cipher_suite_t *)0x0;
                  uVar18 = select_key_share(&(ppVar20->client).key_share,local_78,
                                            local_d0->key_exchanges,(uint8_t **)&local_108,
                                            (uint8_t *)ppVar26,0);
                  uVar30 = 0x32;
                  if (local_108 == ppVar26) {
                    uVar30 = uVar37;
                  }
                  if (uVar18 != 0) {
                    uVar30 = (ulong)uVar18;
                  }
                  uVar37 = (ulong)(uVar18 == 0 && local_108 == ppVar26);
                }
              }
              if ((char)uVar37 != '\0') {
                uVar30 = 0x32;
                if ((ulong)((long)local_d8 - (long)local_108) < 2) {
                  bVar45 = false;
                  ppVar26 = local_108;
                }
                else {
                  lVar24 = 0;
                  uVar42 = 0;
                  do {
                    uVar42 = (ulong)*(uint8_t *)((long)&local_108->id + lVar24) | uVar42 << 8;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 2);
                  local_108 = (ptls_cipher_suite_t *)&local_108->field_0x2;
                  if ((ulong)((long)local_d8 - (long)local_108) < uVar42) {
                    bVar45 = false;
                    ppVar26 = local_108;
                  }
                  else {
                    ppVar26 = (ptls_cipher_suite_t *)((long)local_108 + uVar42);
                    uVar18 = select_cipher(&(ppVar20->client).cipher,local_d0->cipher_suites,
                                           (uint8_t *)local_108,(uint8_t *)ppVar26);
                    uVar30 = 0;
                    bVar45 = uVar18 == 0;
                    if (!bVar45) {
                      uVar30 = (ulong)uVar18;
                      ppVar26 = local_108;
                    }
                  }
                }
                local_108 = ppVar26;
                ppVar26 = local_d8;
                if ((bVar45) && (uVar30 = 0x32, 1 < (long)local_d8 - (long)local_108)) {
                  (ppVar20->client).padded_length = local_108->id << 8 | local_108->id >> 8;
                  local_108 = (ptls_cipher_suite_t *)&local_108->field_0x2;
                  uVar18 = ptls_decode64((uint64_t *)&local_98,(uint8_t **)&local_108,
                                         (uint8_t *)local_d8);
                  if ((uVar18 == 0) &&
                     (uVar18 = ptls_decode64(&local_b0,(uint8_t **)&local_108,(uint8_t *)ppVar26),
                     uVar18 == 0)) {
                    uVar30 = 0x32;
                    if ((ulong)((long)ppVar26 - (long)local_108) < 2) {
                      bVar45 = false;
                    }
                    else {
                      lVar24 = 0;
                      uVar42 = 0;
                      do {
                        uVar42 = (ulong)*(uint8_t *)((long)&local_108->id + lVar24) | uVar42 << 8;
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 2);
                      local_108 = (ptls_cipher_suite_t *)&local_108->field_0x2;
                      uVar18 = 0;
                      bVar45 = false;
                      if (uVar42 <= (ulong)((long)local_d8 - (long)local_108)) {
                        if (uVar42 == 0) {
                          bVar45 = true;
                        }
                        else {
                          ppVar40 = (ptls_cipher_suite_t *)((long)local_108 + uVar42);
                          ppVar26 = local_108;
                          do {
                            uVar30 = (ulong)((uint)(1 < (long)ppVar40 - (long)ppVar26) * 2);
                            local_108 = (ptls_cipher_suite_t *)((long)&ppVar26->id + uVar30);
                            bVar45 = true;
                            uVar18 = 0x32;
                            in_R9 = local_108;
                            if ((long)ppVar40 - (long)ppVar26 < 2) {
                              bVar44 = false;
                            }
                            else {
                              uVar18 = 0x32;
                              if ((ulong)((long)ppVar40 - (long)local_108) < 2) {
                                bVar44 = false;
                              }
                              else {
                                lVar24 = 0;
                                ppVar32 = (ptls_cipher_suite_t *)0x0;
                                do {
                                  ppVar32 = (ptls_cipher_suite_t *)
                                            ((ulong)*(uint8_t *)((long)&local_108->id + lVar24) |
                                            (long)ppVar32 << 8);
                                  lVar24 = lVar24 + 1;
                                } while (lVar24 != 2);
                                local_108 = (ptls_cipher_suite_t *)(&ppVar26->field_0x2 + uVar30);
                                in_R9 = (ptls_cipher_suite_t *)((long)ppVar40 - (long)local_108);
                                bVar44 = false;
                                if (ppVar32 <= in_R9) {
                                  local_108 = (ptls_cipher_suite_t *)
                                              ((long)&ppVar32->id + (long)&local_108->id);
                                  bVar44 = true;
                                  bVar45 = false;
                                  uVar18 = 0;
                                }
                              }
                            }
                            if (!bVar44) goto LAB_00115020;
                            ppVar26 = local_108;
                          } while (local_108 != ppVar40);
                          bVar45 = false;
LAB_00115020:
                          bVar45 = !bVar45;
                        }
                        uVar30 = (ulong)uVar18;
                      }
                    }
                    if (bVar45) {
                      if ((local_108 == local_d8) &&
                         (uVar23 = (*local_d0->get_time->cb)(local_d0->get_time),
                         (ulong)((long)local_98.base * 1000) < uVar23 ||
                         (long)local_98.base * 1000 - uVar23 == 0)) {
                        uVar30 = 0x32;
                        if (uVar23 <= local_b0 * 1000) {
                          uVar30 = 0;
                        }
                      }
                      else {
                        uVar30 = 0x32;
                      }
                    }
                  }
                  else {
                    uVar30 = (ulong)uVar18;
                  }
                }
              }
            }
            else {
              uVar30 = (ulong)uVar18;
            }
          }
          else {
            local_110 = (char *)0x0;
            ppVar41 = local_e8;
          }
        }
        esni = &tls->esni;
        if ((int)uVar30 == 0) {
          local_e8 = ppVar41;
          (*local_d0->random_bytes)((*esni)->nonce,0x10);
          in_R8W = (uint16_t)uVar30;
          ppVar20 = *esni;
          ppVar22 = (*((ppVar20->client).cipher)->hash->create)();
          if (ppVar22 == (ptls_hash_context_t *)0x0) {
            iVar16 = 0x201;
          }
          else {
            (*ppVar22->update)(ppVar22,local_f8,sVar39);
            (*ppVar22->final)(ppVar22,(ppVar20->client).record_digest,PTLS_HASH_FINAL_MODE_FREE);
            ppVar20 = *esni;
            psVar10 = (ppVar20->client).key_share;
            pVar15.base._4_4_ = local_78[0].base._4_4_;
            pVar15.base._0_4_ = (int)local_78[0].base;
            pVar15.len = local_78[0].len;
            iVar16 = (*psVar10->exchange)(psVar10,&(ppVar20->client).pubkey,&ppVar20->secret,pVar15)
            ;
            in_R8W = (uint16_t)local_78[0].len;
            if (iVar16 == 0) {
              in_stack_fffffffffffffeb8 = tls->client_random;
              ppVar20 = *esni;
              ppVar11 = &(ppVar20->client).pubkey;
              in_R8W = (uint16_t)ppVar11->base;
              in_R9 = (ptls_cipher_suite_t *)(ppVar20->client).pubkey.len;
              iVar16 = build_esni_contents_hash
                                 (((ppVar20->client).cipher)->hash,ppVar20->esni_contents_hash,
                                  (ppVar20->client).record_digest,((ppVar20->client).key_share)->id,
                                  *ppVar11,in_stack_fffffffffffffeb8);
            }
          }
          ppVar41 = local_e8;
          if (iVar16 != 0) {
            free_esni_secret(esni,0);
          }
        }
        else {
          free(*esni);
          in_R8W = (uint16_t)uVar30;
          *esni = (ptls_esni_secret_t *)0x0;
          iVar16 = 0;
        }
      }
      if (iVar16 != 0) goto LAB_001158c4;
      psVar6 = tls->ctx->update_esni_key;
      if (psVar6 != (st_ptls_update_esni_key_t *)0x0) {
        ppVar20 = tls->esni;
        ppVar31 = ((ppVar20->client).cipher)->hash;
        in_R9 = (ptls_cipher_suite_t *)ppVar20->esni_contents_hash;
        iVar16 = (*psVar6->cb)(psVar6,tls,ppVar20->secret,ppVar31,in_R9);
        in_R8W = (uint16_t)ppVar31;
        if (iVar16 != 0) goto LAB_001158c4;
      }
    }
    else {
      local_110 = (char *)0x0;
    }
    ppVar26 = (ptls_cipher_suite_t *)0x0;
    ppVar40 = (ptls_cipher_suite_t *)(local_e0->field_0).client.session_ticket.base;
    if (ppVar40 == (ptls_cipher_suite_t *)0x0) {
      local_f8 = (ptls_cipher_suite_t *)0x0;
      uVar30 = 0;
    }
    else {
      ppVar32 = (ptls_cipher_suite_t *)
                ((long)&ppVar40->id + (local_e0->field_0).client.session_ticket.len);
      local_108 = ppVar40;
      iVar16 = ptls_decode64(&local_b0,(uint8_t **)&local_108,(uint8_t *)ppVar32);
      local_e8 = ppVar41;
      if (iVar16 == 0) {
        lVar24 = (long)ppVar32 - (long)local_108;
        if (lVar24 < 2) {
          iVar16 = 0x32;
        }
        else {
          local_f8 = (ptls_cipher_suite_t *)
                     CONCAT62(local_f8._2_6_,local_108->id << 8 | local_108->id >> 8);
          local_108 = (ptls_cipher_suite_t *)&local_108->field_0x2;
          iVar16 = 0;
        }
        in_R9 = (ptls_cipher_suite_t *)0x0;
        ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
        ppVar26 = (ptls_cipher_suite_t *)0x0;
        uVar42 = 0;
        ppVar40 = (ptls_cipher_suite_t *)0x0;
        if (1 < lVar24) {
          lVar24 = (long)ppVar32 - (long)local_108;
          if (lVar24 < 2) {
            iVar16 = 0x32;
          }
          else {
            in_R8W = local_108->id << 8 | local_108->id >> 8;
            local_108 = (ptls_cipher_suite_t *)&local_108->field_0x2;
            iVar16 = 0;
          }
          in_R9 = (ptls_cipher_suite_t *)0x0;
          ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
          ppVar26 = (ptls_cipher_suite_t *)0x0;
          uVar42 = 0;
          ppVar40 = (ptls_cipher_suite_t *)0x0;
          if (1 < lVar24) {
            if ((ulong)((long)ppVar32 - (long)local_108) < 3) {
LAB_00114072:
              bVar45 = false;
              iVar16 = 0x32;
              ppVar26 = local_108;
            }
            else {
              lVar24 = 0;
              uVar30 = 0;
              do {
                uVar30 = (ulong)*(uint8_t *)((long)&local_108->id + lVar24) | uVar30 << 8;
                lVar24 = lVar24 + 1;
              } while (lVar24 != 3);
              puVar46 = &local_108->field_0x3;
              local_108 = (ptls_cipher_suite_t *)puVar46;
              if ((ulong)((long)ppVar32 - (long)puVar46) < uVar30) goto LAB_00114072;
              ppVar26 = (ptls_cipher_suite_t *)(puVar46 + uVar30);
              iVar19 = decode_new_session_ticket
                                 (tls,&local_7c,&local_a4,local_78,&local_98,&local_a8,puVar46,
                                  (uint8_t *)ppVar26);
              iVar16 = 0;
              bVar45 = iVar19 == 0;
              in_stack_fffffffffffffeb8 = puVar46;
              if (!bVar45) {
                iVar16 = iVar19;
                ppVar26 = local_108;
              }
            }
            local_108 = ppVar26;
            in_R9 = (ptls_cipher_suite_t *)0x0;
            if (bVar45) {
              ppVar26 = (ptls_cipher_suite_t *)0x0;
              if ((ulong)((long)ppVar32 - (long)local_108) < 2) {
                uVar42 = 0;
                bVar45 = false;
                ppVar40 = (ptls_cipher_suite_t *)0x0;
                iVar16 = 0x32;
              }
              else {
                lVar24 = 0;
                uVar42 = 0;
                do {
                  uVar42 = (ulong)*(uint8_t *)((long)&local_108->id + lVar24) | uVar42 << 8;
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 2);
                puVar33 = &local_108->field_0x2;
                if ((ulong)((long)ppVar32 - (long)puVar33) < uVar42) {
                  uVar42 = 0;
                  bVar45 = false;
                  ppVar40 = (ptls_cipher_suite_t *)0x0;
                  iVar16 = 0x32;
                  local_108 = (ptls_cipher_suite_t *)puVar33;
                }
                else {
                  local_108 = (ptls_cipher_suite_t *)(puVar33 + uVar42);
                  bVar45 = true;
                  ppVar40 = (ptls_cipher_suite_t *)puVar33;
                }
              }
              if (bVar45) {
                if (local_108 == ppVar32) {
                  ppVar8 = tls->ctx;
                  pppVar43 = ppVar8->key_exchanges;
                  ppVar36 = *pppVar43;
                  ppVar26 = (ptls_cipher_suite_t *)0x0;
                  bVar45 = ppVar36 == (ptls_key_exchange_algorithm_t *)0x0;
                  if (bVar45) {
LAB_001146b6:
                    ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
                    bVar45 = false;
                    iVar16 = 0x203;
                  }
                  else {
                    uVar4 = ppVar36->id;
                    while (uVar4 != (uint16_t)local_f8) {
                      pppVar43 = pppVar43 + 1;
                      ppVar36 = *pppVar43;
                      bVar45 = ppVar36 == (ptls_key_exchange_algorithm_t *)0x0;
                      if (bVar45) goto LAB_001146b6;
                      uVar4 = ppVar36->id;
                    }
                    if (bVar45) goto LAB_001146b6;
                    bVar45 = true;
                  }
                  if (!bVar45) {
                    in_R9 = (ptls_cipher_suite_t *)0x0;
                    goto LAB_001143dc;
                  }
                  pppVar21 = ppVar8->cipher_suites;
                  in_R9 = *pppVar21;
                  ppVar26 = (ptls_cipher_suite_t *)0x0;
                  bVar45 = in_R9 == (ptls_cipher_suite_t *)0x0;
                  if (bVar45) {
LAB_001149b4:
                    in_R9 = (ptls_cipher_suite_t *)0x0;
                    bVar45 = false;
                    iVar16 = 0x203;
                  }
                  else {
                    uVar4 = in_R9->id;
                    while (uVar4 != in_R8W) {
                      pppVar21 = pppVar21 + 1;
                      in_R9 = *pppVar21;
                      bVar45 = in_R9 == (ptls_cipher_suite_t *)0x0;
                      if (bVar45) goto LAB_001149b4;
                      uVar4 = in_R9->id;
                    }
                    if (bVar45) goto LAB_001149b4;
                    bVar45 = true;
                  }
                  if (bVar45) {
                    uVar23 = (*ppVar8->get_time->cb)(ppVar8->get_time);
                    if (uVar23 < local_b0) {
                      iVar16 = 0x32;
                    }
                    else {
                      if (0x240c83ff < uVar23 - local_b0) goto LAB_001143cf;
                      iVar16 = 0;
                      ppVar26 = (ptls_cipher_suite_t *)(ulong)((int)(uVar23 - local_b0) + local_a4);
                    }
                  }
                }
                else {
                  in_R9 = (ptls_cipher_suite_t *)0x0;
                  ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
LAB_001143cf:
                  ppVar26 = (ptls_cipher_suite_t *)0x0;
                  iVar16 = 0x32;
                }
              }
              else {
                in_R9 = (ptls_cipher_suite_t *)0x0;
                ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
              }
            }
            else {
              ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
              ppVar26 = (ptls_cipher_suite_t *)0x0;
              uVar42 = 0;
              ppVar40 = (ptls_cipher_suite_t *)0x0;
            }
          }
        }
      }
      else {
        in_R9 = (ptls_cipher_suite_t *)0x0;
        ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
        ppVar26 = (ptls_cipher_suite_t *)0x0;
        uVar42 = 0;
        ppVar40 = (ptls_cipher_suite_t *)0x0;
      }
LAB_001143dc:
      local_f8 = (ptls_cipher_suite_t *)0x0;
      uVar30 = 0;
      ppVar41 = local_e8;
      if (iVar16 == 0) {
        bVar3 = (tls->field_18).server.pending_traffic_secret[0x38];
        (tls->field_18).server.pending_traffic_secret[0x38] = bVar3 | 1;
        if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
          tls->key_share = ppVar36;
        }
        tls->cipher_suite = in_R9;
        uVar30 = uVar42;
        local_f8 = ppVar40;
        if ((local_a8 != 0 && local_e8 == (ptls_key_schedule_t *)0x0) &&
           ((local_e0->field_0).client.max_early_data_size != (size_t *)0x0)) {
          (tls->field_18).server.pending_traffic_secret[0x38] = bVar3 | 3;
          *(local_e0->field_0).client.max_early_data_size = (ulong)local_a8;
        }
      }
    }
    pVar17 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
    if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
      psVar7 = (local_e0->field_0).client.max_early_data_size;
      pVar17 = PTLS_EARLY_DATA_REJECTED;
      if (psVar7 != (size_t *)0x0) {
        *psVar7 = 0;
      }
    }
    (local_e0->field_0).client.early_data_acceptance = pVar17;
  }
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     ((local_e0 == (ptls_handshake_properties_t *)0x0 ||
      (((local_e0->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)))) {
    tls->key_share = *tls->ctx->key_exchanges;
  }
  if (ppVar41 == (ptls_key_schedule_t *)0x0) {
    sched = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                             tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = sched;
    ikm.len = uVar30;
    ikm.base = (uint8_t *)local_f8;
    iVar16 = key_schedule_extract(sched,ikm);
    if (iVar16 != 0) goto LAB_001158c4;
  }
  lVar24 = emitter->record_header_length + emitter->buf->off;
  iVar16 = (*emitter->begin_message)(emitter);
  if (iVar16 == 0) {
    ppVar8 = (ptls_context_t *)emitter->buf;
    local_d8 = ppVar26;
    iVar16 = ptls_buffer_reserve((ptls_buffer_t *)ppVar8,1);
    if (iVar16 == 0) {
      ppVar8->random_bytes[(long)ppVar8->key_exchanges] = (_func_void_void_ptr_size_t)0x1;
      ppVar8->key_exchanges = (ptls_key_exchange_algorithm_t **)((long)ppVar8->key_exchanges + 1);
      iVar16 = 0;
    }
    bVar45 = true;
    local_d0 = ppVar8;
    if (iVar16 == 0) {
      iVar16 = ptls_buffer_reserve((ptls_buffer_t *)ppVar8,3);
      if (iVar16 == 0) {
        p_Var9 = local_d0->random_bytes;
        pppVar43 = local_d0->key_exchanges;
        (p_Var9 + 2)[(long)pppVar43] = (code)0x0;
        *(undefined2 *)(p_Var9 + (long)pppVar43) = 0;
        local_d0->key_exchanges =
             (ptls_key_exchange_algorithm_t **)((long)local_d0->key_exchanges + 3);
        iVar16 = 0;
      }
      if (iVar16 == 0) {
        pppVar43 = local_d0->key_exchanges;
        buf = emitter->buf;
        local_e8 = ppVar41;
        iVar16 = ptls_buffer_reserve(buf,2);
        if (iVar16 == 0) {
          puVar46 = buf->base;
          sVar39 = buf->off;
          (puVar46 + sVar39)[0] = '\x03';
          (puVar46 + sVar39)[1] = '\x03';
          buf->off = buf->off + 2;
          iVar16 = 0;
        }
        bVar45 = iVar16 != 0;
        local_a0 = lVar24;
        if (iVar16 == 0) {
          iVar16 = ptls_buffer_reserve(buf,0x20);
          if (iVar16 == 0) {
            puVar46 = buf->base;
            sVar39 = buf->off;
            uVar12 = *(undefined8 *)tls->client_random;
            uVar13 = *(undefined8 *)(tls->client_random + 8);
            uVar14 = *(undefined8 *)(tls->client_random + 0x18);
            puVar2 = puVar46 + sVar39 + 0x10;
            *(undefined8 *)puVar2 = *(undefined8 *)(tls->client_random + 0x10);
            *(undefined8 *)(puVar2 + 8) = uVar14;
            puVar46 = puVar46 + sVar39;
            *(undefined8 *)puVar46 = uVar12;
            *(undefined8 *)(puVar46 + 8) = uVar13;
            buf->off = buf->off + 0x20;
            iVar16 = 0;
          }
          bVar45 = true;
          if (iVar16 == 0) {
            iVar16 = ptls_buffer_reserve(buf,1);
            if (iVar16 == 0) {
              buf->base[buf->off] = '\0';
              buf->off = buf->off + 1;
              iVar16 = 0;
            }
            bVar45 = true;
            if (iVar16 == 0) {
              sVar39 = buf->off;
              iVar19 = ptls_buffer__do_pushv
                                 (buf,(tls->field_18).client.legacy_session_id.base,
                                  (tls->field_18).client.legacy_session_id.len);
              iVar16 = 0;
              if (iVar19 == 0) {
                buf->base[sVar39 - 1] = (char)(int)buf->off - (char)sVar39;
                bVar44 = true;
                bVar45 = false;
              }
              else {
                bVar44 = false;
                iVar16 = iVar19;
              }
            }
            else {
              bVar44 = false;
            }
            if (bVar44) {
              iVar16 = ptls_buffer_reserve(buf,2);
              if (iVar16 == 0) {
                puVar46 = buf->base;
                sVar39 = buf->off;
                (puVar46 + sVar39)[0] = '\0';
                (puVar46 + sVar39)[1] = '\0';
                buf->off = buf->off + 2;
                iVar16 = 0;
              }
              bVar45 = true;
              if (iVar16 == 0) {
                sVar39 = buf->off;
                pppVar21 = tls->ctx->cipher_suites;
                ppVar26 = *pppVar21;
                bVar45 = false;
                if (ppVar26 == (ptls_cipher_suite_t *)0x0) {
                  bVar44 = true;
                  iVar16 = 0;
                }
                else {
                  do {
                    pppVar21 = pppVar21 + 1;
                    uVar5 = ppVar26->id;
                    iVar16 = ptls_buffer_reserve(buf,2);
                    if (iVar16 == 0) {
                      *(ushort *)(buf->base + buf->off) = uVar5 << 8 | uVar5 >> 8;
                      buf->off = buf->off + 2;
                      iVar16 = 0;
                    }
                    bVar44 = iVar16 == 0;
                    if (!bVar44) {
                      bVar45 = true;
                      break;
                    }
                    ppVar26 = *pppVar21;
                  } while (ppVar26 != (ptls_cipher_suite_t *)0x0);
                }
                if (bVar44) {
                  uVar30 = buf->off - sVar39;
                  lVar24 = 8;
                  do {
                    buf->base[sVar39 - 2] = (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                    lVar24 = lVar24 + -8;
                    sVar39 = sVar39 + 1;
                  } while (lVar24 != -8);
                  bVar45 = false;
                }
              }
              if (!bVar45) {
                iVar16 = ptls_buffer_reserve(buf,1);
                if (iVar16 == 0) {
                  buf->base[buf->off] = '\0';
                  buf->off = buf->off + 1;
                  iVar16 = 0;
                }
                bVar45 = true;
                if (iVar16 == 0) {
                  sVar39 = buf->off;
                  iVar16 = ptls_buffer_reserve(buf,1);
                  if (iVar16 == 0) {
                    buf->base[buf->off] = '\0';
                    buf->off = buf->off + 1;
                    iVar16 = 0;
                  }
                  bVar44 = false;
                  if (iVar16 == 0) {
                    buf->base[sVar39 - 1] = (char)(int)buf->off - (char)sVar39;
                    bVar44 = true;
                    bVar45 = false;
                    iVar16 = 0;
                  }
                }
                else {
                  bVar44 = false;
                }
                if (bVar44) {
                  iVar16 = ptls_buffer_reserve(buf,2);
                  if (iVar16 == 0) {
                    puVar46 = buf->base;
                    sVar39 = buf->off;
                    (puVar46 + sVar39)[0] = '\0';
                    (puVar46 + sVar39)[1] = '\0';
                    buf->off = buf->off + 2;
                    iVar16 = 0;
                  }
                  bVar45 = true;
                  if (iVar16 == 0) {
                    local_88 = buf->off;
                    iVar16 = ptls_buffer_reserve(buf,2);
                    if (iVar16 == 0) {
                      puVar46 = buf->base;
                      sVar39 = buf->off;
                      (puVar46 + sVar39)[0] = '\0';
                      (puVar46 + sVar39)[1] = '3';
                      buf->off = buf->off + 2;
                      iVar16 = 0;
                    }
                    bVar45 = iVar16 != 0;
                    if (iVar16 == 0) {
                      iVar16 = ptls_buffer_reserve(buf,2);
                      if (iVar16 == 0) {
                        puVar46 = buf->base;
                        sVar39 = buf->off;
                        (puVar46 + sVar39)[0] = '\0';
                        (puVar46 + sVar39)[1] = '\0';
                        buf->off = buf->off + 2;
                        iVar16 = 0;
                      }
                      if (iVar16 == 0) {
                        local_c8 = buf->off;
                        iVar16 = ptls_buffer_reserve(buf,2);
                        if (iVar16 == 0) {
                          puVar46 = buf->base;
                          sVar39 = buf->off;
                          (puVar46 + sVar39)[0] = '\0';
                          (puVar46 + sVar39)[1] = '\0';
                          buf->off = buf->off + 2;
                          iVar16 = 0;
                        }
                        bVar45 = true;
                        if (iVar16 == 0) {
                          sVar39 = buf->off;
                          psVar10 = tls->key_share;
                          if ((psVar10 != (st_ptls_key_exchange_algorithm_t *)0x0) &&
                             ((iVar16 = (*psVar10->create)(psVar10,&(tls->field_18).client.
                                                                    key_share_ctx), iVar16 != 0 ||
                              (iVar16 = push_key_share_entry
                                                  (buf,tls->key_share->id,
                                                   ((tls->field_18).client.key_share_ctx)->pubkey),
                              iVar16 != 0)))) goto LAB_00114e1a;
                          uVar30 = buf->off - sVar39;
                          lVar24 = 8;
                          do {
                            buf->base[sVar39 - 2] = (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                            lVar24 = lVar24 + -8;
                            sVar39 = sVar39 + 1;
                          } while (lVar24 != -8);
                          bVar45 = false;
                          bVar44 = true;
                          iVar16 = 0;
                        }
                        else {
LAB_00114e1a:
                          bVar44 = false;
                        }
                        if (bVar44) {
                          local_b8 = (char *)(buf->off - local_c8);
                          lVar24 = 8;
                          sVar39 = local_c8;
                          do {
                            buf->base[sVar39 - 2] =
                                 (uint8_t)((ulong)local_b8 >> ((byte)lVar24 & 0x3f));
                            lVar24 = lVar24 + -8;
                            sVar39 = sVar39 + 1;
                          } while (lVar24 != -8);
                          bVar45 = false;
                        }
                      }
                      else {
                        bVar45 = true;
                      }
                      if (!bVar45) {
                        if ((char)local_f0 != '\0') {
                          if (tls->esni == (ptls_esni_secret_t *)0x0) {
                            iVar16 = ptls_buffer_reserve(buf,2);
                            if (iVar16 == 0) {
                              puVar46 = buf->base;
                              sVar39 = buf->off;
                              (puVar46 + sVar39)[0] = '\0';
                              (puVar46 + sVar39)[1] = '\0';
                              buf->off = buf->off + 2;
                              iVar16 = 0;
                            }
                            bVar45 = iVar16 != 0;
                            if (bVar45) goto LAB_0011565b;
                            iVar16 = ptls_buffer_reserve(buf,2);
                            if (iVar16 == 0) {
                              puVar46 = buf->base;
                              sVar39 = buf->off;
                              (puVar46 + sVar39)[0] = '\0';
                              (puVar46 + sVar39)[1] = '\0';
                              buf->off = buf->off + 2;
                              iVar16 = 0;
                            }
                            if (iVar16 == 0) {
                              sVar39 = buf->off;
                              iVar16 = emit_server_name_extension(buf,tls->server_name);
                              if (iVar16 == 0) {
                                uVar30 = buf->off - sVar39;
                                lVar24 = 8;
                                do {
                                  buf->base[sVar39 - 2] = (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f))
                                  ;
                                  lVar24 = lVar24 + -8;
                                  sVar39 = sVar39 + 1;
                                } while (lVar24 != -8);
                                goto LAB_001153ad;
                              }
                            }
                            goto LAB_00115131;
                          }
                          if (local_110 != (char *)0x0) {
                            iVar16 = ptls_buffer_reserve(buf,2);
                            if (iVar16 == 0) {
                              puVar46 = buf->base;
                              sVar39 = buf->off;
                              (puVar46 + sVar39)[0] = '\0';
                              (puVar46 + sVar39)[1] = '\0';
                              buf->off = buf->off + 2;
                              iVar16 = 0;
                            }
                            bVar45 = iVar16 != 0;
                            if (bVar45) goto LAB_0011565b;
                            iVar16 = ptls_buffer_reserve(buf,2);
                            if (iVar16 == 0) {
                              puVar46 = buf->base;
                              sVar39 = buf->off;
                              (puVar46 + sVar39)[0] = '\0';
                              (puVar46 + sVar39)[1] = '\0';
                              buf->off = buf->off + 2;
                              iVar16 = 0;
                            }
                            bVar45 = true;
                            if (iVar16 == 0) {
                              sVar39 = buf->off;
                              iVar16 = emit_server_name_extension(buf,local_110);
                              if (iVar16 != 0) goto LAB_00114f24;
                              uVar30 = buf->off - sVar39;
                              lVar24 = 8;
                              do {
                                buf->base[sVar39 - 2] = (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                lVar24 = lVar24 + -8;
                                sVar39 = sVar39 + 1;
                              } while (lVar24 != -8);
                              bVar45 = false;
                              bVar44 = true;
                              iVar16 = 0;
                            }
                            else {
LAB_00114f24:
                              bVar44 = false;
                            }
                            if (!bVar44) goto LAB_0011565b;
                          }
                          iVar16 = ptls_buffer_reserve(buf,2);
                          if (iVar16 == 0) {
                            puVar46 = buf->base;
                            sVar39 = buf->off;
                            (puVar46 + sVar39)[0] = 0xff;
                            (puVar46 + sVar39)[1] = 0xce;
                            buf->off = buf->off + 2;
                            iVar16 = 0;
                          }
                          bVar45 = iVar16 != 0;
                          if (bVar45) goto LAB_0011565b;
                          iVar16 = ptls_buffer_reserve(buf,2);
                          if (iVar16 == 0) {
                            puVar46 = buf->base;
                            sVar39 = buf->off;
                            (puVar46 + sVar39)[0] = '\0';
                            (puVar46 + sVar39)[1] = '\0';
                            buf->off = buf->off + 2;
                            iVar16 = 0;
                          }
                          if (iVar16 == 0) {
                            sVar39 = buf->off;
                            esni_keys.len = local_c8;
                            esni_keys.base = (uint8_t *)tls->server_name;
                            iVar16 = emit_esni_extension(tls->esni,buf,esni_keys,local_b8,
                                                         (size_t)in_R9,
                                                         (size_t)in_stack_fffffffffffffeb8);
                            if (iVar16 != 0) goto LAB_00115131;
                            uVar30 = buf->off - sVar39;
                            lVar24 = 8;
                            do {
                              buf->base[sVar39 - 2] = (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                              lVar24 = lVar24 + -8;
                              sVar39 = sVar39 + 1;
                            } while (lVar24 != -8);
LAB_001153ad:
                            bVar45 = false;
                            bVar44 = true;
                            iVar16 = 0;
                          }
                          else {
LAB_00115131:
                            bVar45 = true;
                            bVar44 = false;
                          }
                          if (!bVar44) goto LAB_0011565b;
                        }
                        if ((local_e0 == (ptls_handshake_properties_t *)0x0) ||
                           ((local_e0->field_0).client.negotiated_protocols.count == 0)) {
LAB_00115448:
                          if (tls->ctx->decompress_certificate ==
                              (ptls_decompress_certificate_t *)0x0) {
LAB_00115614:
                            iVar16 = ptls_buffer_reserve(buf,2);
                            if (iVar16 == 0) {
                              puVar46 = buf->base;
                              sVar39 = buf->off;
                              (puVar46 + sVar39)[0] = '\0';
                              (puVar46 + sVar39)[1] = '+';
                              buf->off = buf->off + 2;
                              iVar16 = 0;
                            }
                            bVar45 = iVar16 != 0;
                            if (!bVar45) {
                              iVar16 = ptls_buffer_reserve(buf,2);
                              if (iVar16 == 0) {
                                puVar46 = buf->base;
                                sVar39 = buf->off;
                                (puVar46 + sVar39)[0] = '\0';
                                (puVar46 + sVar39)[1] = '\0';
                                buf->off = buf->off + 2;
                                iVar16 = 0;
                              }
                              bVar45 = true;
                              if (iVar16 == 0) {
                                sVar39 = buf->off;
                                iVar16 = ptls_buffer_reserve(buf,1);
                                if (iVar16 == 0) {
                                  buf->base[buf->off] = '\0';
                                  buf->off = buf->off + 1;
                                  iVar16 = 0;
                                }
                                bVar45 = true;
                                if (iVar16 == 0) {
                                  local_f0 = (ptls_key_exchange_algorithm_t **)buf->off;
                                  lVar24 = 0;
                                  do {
                                    uVar5 = *(ushort *)((long)supported_versions + lVar24);
                                    iVar16 = ptls_buffer_reserve(buf,2);
                                    if (iVar16 == 0) {
                                      *(ushort *)(buf->base + buf->off) = uVar5 << 8 | uVar5 >> 8;
                                      buf->off = buf->off + 2;
                                      iVar16 = 0;
                                    }
                                    if (iVar16 != 0) {
                                      bVar45 = true;
                                      goto LAB_00115a21;
                                    }
                                    lVar24 = lVar24 + 2;
                                  } while (lVar24 != 8);
                                  bVar45 = false;
LAB_00115a21:
                                  if (iVar16 == 0) {
                                    (buf->base + -1)[(long)local_f0] =
                                         (char)(int)buf->off - (char)local_f0;
                                    bVar45 = false;
                                  }
                                }
                                if (!bVar45) {
                                  uVar30 = buf->off - sVar39;
                                  lVar24 = 8;
                                  do {
                                    buf->base[sVar39 - 2] =
                                         (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                    lVar24 = lVar24 + -8;
                                    sVar39 = sVar39 + 1;
                                  } while (lVar24 != -8);
                                  bVar45 = false;
                                }
                              }
                              if (!bVar45) {
                                iVar16 = ptls_buffer_reserve(buf,2);
                                if (iVar16 == 0) {
                                  puVar46 = buf->base;
                                  sVar39 = buf->off;
                                  (puVar46 + sVar39)[0] = '\0';
                                  (puVar46 + sVar39)[1] = '\r';
                                  buf->off = buf->off + 2;
                                  iVar16 = 0;
                                }
                                bVar45 = iVar16 != 0;
                                if (!bVar45) {
                                  iVar16 = ptls_buffer_reserve(buf,2);
                                  if (iVar16 == 0) {
                                    puVar46 = buf->base;
                                    sVar39 = buf->off;
                                    (puVar46 + sVar39)[0] = '\0';
                                    (puVar46 + sVar39)[1] = '\0';
                                    buf->off = buf->off + 2;
                                    iVar16 = 0;
                                  }
                                  bVar45 = true;
                                  if (iVar16 == 0) {
                                    sVar39 = buf->off;
                                    iVar16 = push_signature_algorithms(buf);
                                    if (iVar16 != 0) goto LAB_00115b11;
                                    uVar30 = buf->off - sVar39;
                                    lVar24 = 8;
                                    do {
                                      buf->base[sVar39 - 2] =
                                           (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                      lVar24 = lVar24 + -8;
                                      sVar39 = sVar39 + 1;
                                    } while (lVar24 != -8);
                                    bVar45 = false;
                                    bVar44 = true;
                                    iVar16 = 0;
                                  }
                                  else {
LAB_00115b11:
                                    bVar44 = false;
                                  }
                                  if (bVar44) {
                                    iVar16 = ptls_buffer_reserve(buf,2);
                                    if (iVar16 == 0) {
                                      puVar46 = buf->base;
                                      sVar39 = buf->off;
                                      (puVar46 + sVar39)[0] = '\0';
                                      (puVar46 + sVar39)[1] = '\n';
                                      buf->off = buf->off + 2;
                                      iVar16 = 0;
                                    }
                                    bVar45 = iVar16 != 0;
                                    if (!bVar45) {
                                      iVar16 = ptls_buffer_reserve(buf,2);
                                      if (iVar16 == 0) {
                                        puVar46 = buf->base;
                                        sVar39 = buf->off;
                                        (puVar46 + sVar39)[0] = '\0';
                                        (puVar46 + sVar39)[1] = '\0';
                                        buf->off = buf->off + 2;
                                        iVar16 = 0;
                                      }
                                      bVar45 = true;
                                      if (iVar16 == 0) {
                                        sVar39 = buf->off;
                                        local_f0 = tls->ctx->key_exchanges;
                                        iVar16 = ptls_buffer_reserve(buf,2);
                                        if (iVar16 == 0) {
                                          puVar46 = buf->base;
                                          sVar28 = buf->off;
                                          (puVar46 + sVar28)[0] = '\0';
                                          (puVar46 + sVar28)[1] = '\0';
                                          buf->off = buf->off + 2;
                                          iVar16 = 0;
                                        }
                                        bVar45 = true;
                                        if (iVar16 == 0) {
                                          sVar28 = buf->off;
                                          ppVar36 = *local_f0;
                                          iVar16 = 0;
                                          if (ppVar36 != (ptls_key_exchange_algorithm_t *)0x0) {
                                            local_f0 = local_f0 + 1;
                                            do {
                                              local_c8 = CONCAT62(local_c8._2_6_,ppVar36->id);
                                              iVar16 = ptls_buffer_reserve(buf,2);
                                              if (iVar16 == 0) {
                                                *(ushort *)(buf->base + buf->off) =
                                                     (ushort)local_c8 << 8 | (ushort)local_c8 >> 8;
                                                buf->off = buf->off + 2;
                                                iVar16 = 0;
                                              }
                                              if (iVar16 != 0) {
                                                bVar44 = false;
                                                goto LAB_00115cfc;
                                              }
                                              ppVar36 = *local_f0;
                                              local_f0 = local_f0 + 1;
                                            } while (ppVar36 != (ptls_key_exchange_algorithm_t *)0x0
                                                    );
                                          }
                                          uVar30 = buf->off - sVar28;
                                          lVar24 = 8;
                                          do {
                                            buf->base[sVar28 - 2] =
                                                 (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                            lVar24 = lVar24 + -8;
                                            sVar28 = sVar28 + 1;
                                          } while (lVar24 != -8);
                                          bVar45 = false;
                                          bVar44 = true;
                                        }
                                        else {
                                          bVar44 = false;
                                        }
LAB_00115cfc:
                                        if (bVar44) {
                                          uVar30 = buf->off - sVar39;
                                          lVar24 = 8;
                                          do {
                                            buf->base[sVar39 - 2] =
                                                 (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                            lVar24 = lVar24 + -8;
                                            sVar39 = sVar39 + 1;
                                          } while (lVar24 != -8);
                                          bVar45 = false;
                                        }
                                      }
                                      if (!bVar45) {
                                        if ((local_c0 != (ptls_iovec_t *)0x0) &&
                                           (local_c0->base != (uint8_t *)0x0)) {
                                          iVar16 = ptls_buffer_reserve(buf,2);
                                          if (iVar16 == 0) {
                                            puVar46 = buf->base;
                                            sVar39 = buf->off;
                                            (puVar46 + sVar39)[0] = '\0';
                                            (puVar46 + sVar39)[1] = ',';
                                            buf->off = buf->off + 2;
                                            iVar16 = 0;
                                          }
                                          bVar45 = iVar16 != 0;
                                          if (bVar45) goto LAB_0011565b;
                                          iVar16 = ptls_buffer_reserve(buf,2);
                                          if (iVar16 == 0) {
                                            puVar46 = buf->base;
                                            sVar39 = buf->off;
                                            (puVar46 + sVar39)[0] = '\0';
                                            (puVar46 + sVar39)[1] = '\0';
                                            buf->off = buf->off + 2;
                                            iVar16 = 0;
                                          }
                                          bVar45 = true;
                                          if (iVar16 == 0) {
                                            sVar39 = buf->off;
                                            iVar16 = ptls_buffer_reserve(buf,2);
                                            if (iVar16 == 0) {
                                              puVar46 = buf->base;
                                              sVar28 = buf->off;
                                              (puVar46 + sVar28)[0] = '\0';
                                              (puVar46 + sVar28)[1] = '\0';
                                              buf->off = buf->off + 2;
                                              iVar16 = 0;
                                            }
                                            bVar45 = true;
                                            if (iVar16 == 0) {
                                              sVar28 = buf->off;
                                              iVar16 = ptls_buffer__do_pushv
                                                                 (buf,local_c0->base,local_c0->len);
                                              if (iVar16 != 0) goto LAB_00115e3e;
                                              uVar30 = buf->off - sVar28;
                                              lVar24 = 8;
                                              do {
                                                buf->base[sVar28 - 2] =
                                                     (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                                lVar24 = lVar24 + -8;
                                                sVar28 = sVar28 + 1;
                                              } while (lVar24 != -8);
                                              bVar45 = false;
                                              bVar44 = true;
                                              iVar16 = 0;
                                            }
                                            else {
LAB_00115e3e:
                                              bVar44 = false;
                                            }
                                            if (bVar44) {
                                              uVar30 = buf->off - sVar39;
                                              lVar24 = 8;
                                              do {
                                                buf->base[sVar39 - 2] =
                                                     (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                                lVar24 = lVar24 + -8;
                                                sVar39 = sVar39 + 1;
                                              } while (lVar24 != -8);
                                              bVar45 = false;
                                            }
                                          }
                                          if (bVar45) goto LAB_0011565b;
                                        }
                                        iVar16 = push_additional_extensions(local_e0,buf);
                                        bVar45 = true;
                                        if (iVar16 == 0) {
                                          iVar16 = 0;
                                          if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0 &&
                                              local_f8 == (ptls_cipher_suite_t *)0x0) {
LAB_00115fbc:
                                            if (local_f8 == (ptls_cipher_suite_t *)0x0) {
LAB_001164bc:
                                              bVar45 = false;
                                            }
                                            else if (((tls->field_18).server.pending_traffic_secret
                                                      [0x38] & 2) == 0 ||
                                                     local_e8 != (ptls_key_schedule_t *)0x0) {
LAB_00115fe8:
                                              iVar16 = ptls_buffer_reserve(buf,2);
                                              if (iVar16 == 0) {
                                                puVar46 = buf->base;
                                                sVar39 = buf->off;
                                                (puVar46 + sVar39)[0] = '\0';
                                                (puVar46 + sVar39)[1] = ')';
                                                buf->off = buf->off + 2;
                                                iVar16 = 0;
                                              }
                                              bVar45 = iVar16 != 0;
                                              if (!bVar45) {
                                                iVar16 = ptls_buffer_reserve(buf,2);
                                                if (iVar16 == 0) {
                                                  puVar46 = buf->base;
                                                  sVar39 = buf->off;
                                                  (puVar46 + sVar39)[0] = '\0';
                                                  (puVar46 + sVar39)[1] = '\0';
                                                  buf->off = buf->off + 2;
                                                  iVar16 = 0;
                                                }
                                                bVar45 = true;
                                                if (iVar16 == 0) {
                                                  local_e0 = (ptls_handshake_properties_t *)buf->off
                                                  ;
                                                  iVar16 = ptls_buffer_reserve(buf,2);
                                                  if (iVar16 == 0) {
                                                    puVar46 = buf->base;
                                                    sVar39 = buf->off;
                                                    (puVar46 + sVar39)[0] = '\0';
                                                    (puVar46 + sVar39)[1] = '\0';
                                                    buf->off = buf->off + 2;
                                                    iVar16 = 0;
                                                  }
                                                  bVar45 = true;
                                                  if (iVar16 == 0) {
                                                    sVar39 = buf->off;
                                                    iVar16 = ptls_buffer_reserve(buf,2);
                                                    if (iVar16 == 0) {
                                                      puVar46 = buf->base;
                                                      sVar28 = buf->off;
                                                      (puVar46 + sVar28)[0] = '\0';
                                                      (puVar46 + sVar28)[1] = '\0';
                                                      buf->off = buf->off + 2;
                                                      iVar16 = 0;
                                                    }
                                                    bVar45 = true;
                                                    if (iVar16 == 0) {
                                                      sVar28 = buf->off;
                                                      iVar16 = ptls_buffer__do_pushv
                                                                         (buf,local_98.base,
                                                                          local_98.len);
                                                      if (iVar16 != 0) goto LAB_0011610e;
                                                      uVar30 = buf->off - sVar28;
                                                      lVar24 = 8;
                                                      do {
                                                        buf->base[sVar28 - 2] =
                                                             (uint8_t)(uVar30 >>
                                                                      ((byte)lVar24 & 0x3f));
                                                        lVar24 = lVar24 + -8;
                                                        sVar28 = sVar28 + 1;
                                                      } while (lVar24 != -8);
                                                      bVar45 = false;
                                                      bVar44 = true;
                                                      iVar16 = 0;
                                                    }
                                                    else {
LAB_0011610e:
                                                      bVar44 = false;
                                                    }
                                                    if (bVar44) {
                                                      iVar16 = ptls_buffer_reserve(buf,4);
                                                      if (iVar16 == 0) {
                                                        uVar18 = (uint)local_d8;
                                                        *(uint *)(buf->base + buf->off) =
                                                             uVar18 >> 0x18 |
                                                             (uVar18 & 0xff0000) >> 8 |
                                                             (uVar18 & 0xff00) << 8 | uVar18 << 0x18
                                                        ;
                                                        buf->off = buf->off + 4;
                                                        iVar16 = 0;
                                                      }
                                                      bVar45 = iVar16 != 0;
                                                      if (iVar16 == 0) {
                                                        uVar30 = buf->off - sVar39;
                                                        lVar24 = 8;
                                                        do {
                                                          buf->base[sVar39 - 2] =
                                                               (uint8_t)(uVar30 >>
                                                                        ((byte)lVar24 & 0x3f));
                                                          lVar24 = lVar24 + -8;
                                                          sVar39 = sVar39 + 1;
                                                        } while (lVar24 != -8);
                                                        bVar45 = false;
                                                      }
                                                    }
                                                  }
                                                  if (!bVar45) {
                                                    iVar16 = ptls_buffer_reserve(buf,2);
                                                    if (iVar16 == 0) {
                                                      puVar46 = buf->base;
                                                      sVar39 = buf->off;
                                                      (puVar46 + sVar39)[0] = '\0';
                                                      (puVar46 + sVar39)[1] = '\0';
                                                      buf->off = buf->off + 2;
                                                      iVar16 = 0;
                                                    }
                                                    bVar45 = true;
                                                    if (iVar16 == 0) {
                                                      sVar39 = buf->off;
                                                      iVar16 = ptls_buffer_reserve(buf,1);
                                                      if (iVar16 == 0) {
                                                        buf->base[buf->off] = '\0';
                                                        buf->off = buf->off + 1;
                                                        iVar16 = 0;
                                                      }
                                                      bVar45 = true;
                                                      if (iVar16 == 0) {
                                                        sVar28 = buf->off;
                                                        iVar19 = ptls_buffer_reserve(buf,(tls->
                                                  key_schedule->hashes[0].algo)->digest_size);
                                                  iVar16 = 0;
                                                  if (iVar19 == 0) {
                                                    sVar25 = buf->off +
                                                             (tls->key_schedule->hashes[0].algo)->
                                                             digest_size;
                                                    buf->off = sVar25;
                                                    buf->base[sVar28 - 1] =
                                                         (char)sVar25 - (char)sVar28;
                                                    bVar44 = true;
                                                    bVar45 = false;
                                                  }
                                                  else {
                                                    bVar44 = false;
                                                    iVar16 = iVar19;
                                                  }
                                                  }
                                                  else {
                                                    bVar44 = false;
                                                  }
                                                  if (bVar44) {
                                                    uVar30 = buf->off - sVar39;
                                                    lVar24 = 8;
                                                    do {
                                                      buf->base[sVar39 - 2] =
                                                           (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f)
                                                                    );
                                                      lVar24 = lVar24 + -8;
                                                      sVar39 = sVar39 + 1;
                                                    } while (lVar24 != -8);
                                                    bVar45 = false;
                                                  }
                                                  }
                                                  if (!bVar45) {
                                                    uVar30 = buf->off - (long)local_e0;
                                                    lVar24 = 8;
                                                    do {
                                                      (buf->base + -2)[(long)local_e0] =
                                                           (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f)
                                                                    );
                                                      lVar24 = lVar24 + -8;
                                                      local_e0 = (ptls_handshake_properties_t *)
                                                                 ((long)&(local_e0->field_0).client.
                                                                         negotiated_protocols.list +
                                                                 1);
                                                    } while (lVar24 != -8);
                                                    goto LAB_001164bc;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              iVar16 = ptls_buffer_reserve(buf,2);
                                              if (iVar16 == 0) {
                                                puVar46 = buf->base;
                                                sVar39 = buf->off;
                                                (puVar46 + sVar39)[0] = '\0';
                                                (puVar46 + sVar39)[1] = '*';
                                                buf->off = buf->off + 2;
                                                iVar16 = 0;
                                              }
                                              bVar45 = iVar16 != 0;
                                              if (!bVar45) {
                                                iVar19 = ptls_buffer_reserve(buf,2);
                                                if (iVar19 == 0) {
                                                  puVar46 = buf->base;
                                                  sVar39 = buf->off;
                                                  (puVar46 + sVar39)[0] = '\0';
                                                  (puVar46 + sVar39)[1] = '\0';
                                                  buf->off = buf->off + 2;
                                                  iVar19 = 0;
                                                }
                                                bVar45 = true;
                                                iVar16 = iVar19;
                                                if (iVar19 == 0) {
                                                  sVar39 = buf->off;
                                                  lVar24 = -2;
                                                  do {
                                                    buf->base[lVar24 + sVar39] = '\0';
                                                    lVar24 = lVar24 + 1;
                                                  } while (lVar24 != 0);
                                                  bVar45 = false;
                                                  iVar16 = 0;
                                                }
                                                if (iVar19 == 0) goto LAB_00115fe8;
                                              }
                                            }
                                          }
                                          else {
                                            iVar16 = ptls_buffer_reserve(buf,2);
                                            if (iVar16 == 0) {
                                              puVar46 = buf->base;
                                              sVar39 = buf->off;
                                              (puVar46 + sVar39)[0] = '\0';
                                              (puVar46 + sVar39)[1] = '-';
                                              buf->off = buf->off + 2;
                                              iVar16 = 0;
                                            }
                                            bVar45 = iVar16 != 0;
                                            if (!bVar45) {
                                              iVar16 = ptls_buffer_reserve(buf,2);
                                              if (iVar16 == 0) {
                                                puVar46 = buf->base;
                                                sVar39 = buf->off;
                                                (puVar46 + sVar39)[0] = '\0';
                                                (puVar46 + sVar39)[1] = '\0';
                                                buf->off = buf->off + 2;
                                                iVar16 = 0;
                                              }
                                              bVar45 = true;
                                              if (iVar16 == 0) {
                                                sVar39 = buf->off;
                                                iVar16 = ptls_buffer_reserve(buf,1);
                                                if (iVar16 == 0) {
                                                  buf->base[buf->off] = '\0';
                                                  buf->off = buf->off + 1;
                                                  iVar16 = 0;
                                                }
                                                bVar45 = true;
                                                if (iVar16 == 0) {
                                                  sVar28 = buf->off;
                                                  if ((tls->ctx->field_0x70 & 1) == 0) {
                                                    iVar16 = ptls_buffer_reserve(buf,1);
                                                    if (iVar16 == 0) {
                                                      buf->base[buf->off] = '\0';
                                                      buf->off = buf->off + 1;
                                                      iVar16 = 0;
                                                    }
                                                    if (iVar16 != 0) goto LAB_00115f75;
                                                  }
                                                  iVar16 = ptls_buffer_reserve(buf,1);
                                                  if (iVar16 == 0) {
                                                    buf->base[buf->off] = '\x01';
                                                    buf->off = buf->off + 1;
                                                    iVar16 = 0;
                                                  }
                                                  bVar44 = false;
                                                  if (iVar16 == 0) {
                                                    buf->base[sVar28 - 1] =
                                                         (char)(int)buf->off - (char)sVar28;
                                                    bVar44 = true;
                                                    bVar45 = false;
                                                    iVar16 = 0;
                                                  }
                                                }
                                                else {
LAB_00115f75:
                                                  bVar44 = false;
                                                }
                                                if (bVar44) {
                                                  uVar30 = buf->off - sVar39;
                                                  lVar24 = 8;
                                                  do {
                                                    buf->base[sVar39 - 2] =
                                                         (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                                    lVar24 = lVar24 + -8;
                                                    sVar39 = sVar39 + 1;
                                                  } while (lVar24 != -8);
                                                  bVar45 = false;
                                                }
                                              }
                                              if (!bVar45) goto LAB_00115fbc;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          else {
                            iVar16 = ptls_buffer_reserve(buf,2);
                            if (iVar16 == 0) {
                              puVar46 = buf->base;
                              sVar39 = buf->off;
                              (puVar46 + sVar39)[0] = '\0';
                              (puVar46 + sVar39)[1] = '\x1b';
                              buf->off = buf->off + 2;
                              iVar16 = 0;
                            }
                            bVar45 = iVar16 != 0;
                            if (!bVar45) {
                              iVar16 = ptls_buffer_reserve(buf,2);
                              if (iVar16 == 0) {
                                puVar46 = buf->base;
                                sVar39 = buf->off;
                                (puVar46 + sVar39)[0] = '\0';
                                (puVar46 + sVar39)[1] = '\0';
                                buf->off = buf->off + 2;
                                iVar16 = 0;
                              }
                              bVar45 = true;
                              if (iVar16 == 0) {
                                sVar39 = buf->off;
                                iVar16 = ptls_buffer_reserve(buf,1);
                                if (iVar16 == 0) {
                                  buf->base[buf->off] = '\0';
                                  buf->off = buf->off + 1;
                                  iVar16 = 0;
                                }
                                bVar45 = true;
                                if (iVar16 == 0) {
                                  puVar38 = tls->ctx->decompress_certificate->supported_algorithms;
                                  if (*puVar38 == 0xffff) {
                                    __assert_fail("*algo != UINT16_MAX",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                                                  ,0x7f4,
                                                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                                 );
                                  }
                                  local_c8 = buf->off;
                                  bVar45 = false;
                                  local_f0 = (ptls_key_exchange_algorithm_t **)
                                             CONCAT62(local_f0._2_6_,*puVar38);
                                  if (*puVar38 == 0xffff) {
                                    bVar44 = true;
                                    iVar16 = 0;
                                  }
                                  else {
                                    do {
                                      puVar38 = puVar38 + 1;
                                      iVar16 = ptls_buffer_reserve(buf,2);
                                      if (iVar16 == 0) {
                                        *(ushort *)(buf->base + buf->off) =
                                             (ushort)local_f0 << 8 | (ushort)local_f0 >> 8;
                                        buf->off = buf->off + 2;
                                        iVar16 = 0;
                                      }
                                      bVar44 = iVar16 == 0;
                                      if (!bVar44) {
                                        bVar45 = true;
                                        break;
                                      }
                                      local_f0 = (ptls_key_exchange_algorithm_t **)
                                                 CONCAT62(local_f0._2_6_,*puVar38);
                                    } while (*puVar38 != 0xffff);
                                  }
                                  if (bVar44) {
                                    buf->base[local_c8 - 1] = (char)(int)buf->off - (char)local_c8;
                                    bVar45 = false;
                                  }
                                }
                                if (!bVar45) {
                                  uVar30 = buf->off - sVar39;
                                  lVar24 = 8;
                                  do {
                                    buf->base[sVar39 - 2] =
                                         (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                    lVar24 = lVar24 + -8;
                                    sVar39 = sVar39 + 1;
                                  } while (lVar24 != -8);
                                  bVar45 = false;
                                }
                              }
                              if (!bVar45) goto LAB_00115614;
                            }
                          }
                        }
                        else {
                          iVar16 = ptls_buffer_reserve(buf,2);
                          if (iVar16 == 0) {
                            puVar46 = buf->base;
                            sVar39 = buf->off;
                            (puVar46 + sVar39)[0] = '\0';
                            (puVar46 + sVar39)[1] = '\x10';
                            buf->off = buf->off + 2;
                            iVar16 = 0;
                          }
                          bVar45 = iVar16 != 0;
                          if (!bVar45) {
                            iVar16 = ptls_buffer_reserve(buf,2);
                            if (iVar16 == 0) {
                              puVar46 = buf->base;
                              sVar39 = buf->off;
                              (puVar46 + sVar39)[0] = '\0';
                              (puVar46 + sVar39)[1] = '\0';
                              buf->off = buf->off + 2;
                              iVar16 = 0;
                            }
                            bVar45 = true;
                            if (iVar16 == 0) {
                              sVar39 = buf->off;
                              iVar16 = ptls_buffer_reserve(buf,2);
                              if (iVar16 == 0) {
                                puVar46 = buf->base;
                                sVar28 = buf->off;
                                (puVar46 + sVar28)[0] = '\0';
                                (puVar46 + sVar28)[1] = '\0';
                                buf->off = buf->off + 2;
                                iVar16 = 0;
                              }
                              bVar45 = true;
                              if (iVar16 == 0) {
                                local_f0 = (ptls_key_exchange_algorithm_t **)buf->off;
                                if ((local_e0->field_0).client.negotiated_protocols.count == 0) {
                                  bVar45 = false;
                                  iVar16 = 0;
                                }
                                else {
                                  lVar24 = 8;
                                  local_c8 = 0;
                                  do {
                                    iVar16 = ptls_buffer_reserve(buf,1);
                                    if (iVar16 == 0) {
                                      buf->base[buf->off] = '\0';
                                      buf->off = buf->off + 1;
                                      iVar16 = 0;
                                    }
                                    bVar45 = true;
                                    if (iVar16 == 0) {
                                      local_b8 = (char *)buf->off;
                                      ppVar11 = (local_e0->field_0).client.negotiated_protocols.list
                                      ;
                                      iVar16 = ptls_buffer__do_pushv
                                                         (buf,*(void **)((long)ppVar11 + lVar24 + -8
                                                                        ),
                                                          *(size_t *)((long)&ppVar11->base + lVar24)
                                                         );
                                      bVar45 = iVar16 != 0;
                                      if (iVar16 == 0) {
                                        local_b8[(long)(buf->base + -1)] =
                                             (char)(int)buf->off - (char)local_b8;
                                        bVar45 = false;
                                      }
                                    }
                                    if (bVar45) goto LAB_001153be;
                                    local_c8 = local_c8 + 1;
                                    lVar24 = lVar24 + 0x10;
                                  } while (local_c8 !=
                                           (local_e0->field_0).client.negotiated_protocols.count);
                                  bVar45 = false;
                                }
LAB_001153be:
                                if (!bVar45) {
                                  uVar30 = buf->off - (long)local_f0;
                                  lVar24 = 8;
                                  do {
                                    (buf->base + -2)[(long)local_f0] =
                                         (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f));
                                    lVar24 = lVar24 + -8;
                                    local_f0 = (ptls_key_exchange_algorithm_t **)
                                               ((long)local_f0 + 1);
                                  } while (lVar24 != -8);
                                  bVar45 = false;
                                }
                              }
                              if (!bVar45) {
                                uVar30 = buf->off - sVar39;
                                lVar24 = 8;
                                do {
                                  buf->base[sVar39 - 2] = (uint8_t)(uVar30 >> ((byte)lVar24 & 0x3f))
                                  ;
                                  lVar24 = lVar24 + -8;
                                  sVar39 = sVar39 + 1;
                                } while (lVar24 != -8);
                                bVar45 = false;
                              }
                            }
                            if (!bVar45) goto LAB_00115448;
                          }
                        }
                      }
                    }
LAB_0011565b:
                    if (!bVar45) {
                      sVar39 = buf->off;
                      lVar24 = 8;
                      bVar45 = false;
                      sVar28 = local_88;
                      do {
                        buf->base[sVar28 - 2] =
                             (uint8_t)(sVar39 - local_88 >> ((byte)lVar24 & 0x3f));
                        lVar24 = lVar24 + -8;
                        sVar28 = sVar28 + 1;
                      } while (lVar24 != -8);
                    }
                  }
                }
              }
            }
          }
        }
        lVar24 = local_a0;
        ppVar41 = local_e8;
        if (!bVar45) {
          uVar30 = (long)local_d0->key_exchanges - (long)pppVar43;
          lVar35 = 0x10;
          do {
            (local_d0->random_bytes + -3)[(long)pppVar43] = SUB81(uVar30 >> ((byte)lVar35 & 0x3f),0)
            ;
            lVar35 = lVar35 + -8;
            pppVar43 = (ptls_key_exchange_algorithm_t **)((long)pppVar43 + 1);
          } while (lVar35 != -8);
          bVar45 = false;
        }
      }
    }
    if (!bVar45) {
      iVar16 = (*emitter->commit_message)(emitter);
      bVar45 = iVar16 != 0;
    }
  }
  else {
    bVar45 = true;
  }
  if (!bVar45) {
    if (bVar45) {
      return iVar16;
    }
    lVar35 = lVar24;
    local_e8 = ppVar41;
    if (local_f8 != (ptls_cipher_suite_t *)0x0) {
      sVar39 = emitter->buf->off;
      ppVar41 = tls->key_schedule;
      ppVar31 = ppVar41->hashes[0].algo;
      sVar28 = ppVar31->digest_size;
      local_108 = (ptls_cipher_suite_t *)ppVar31->empty_digest;
      secret.base = ppVar41->secret;
      hash_value.len = sVar28;
      hash_value.base = (uint8_t *)local_108;
      secret.len = sVar28;
      sStack_100 = sVar28;
      iVar16 = hkdf_expand_label(ppVar31,local_78,sVar28,secret,"res binder",hash_value,
                                 ppVar41->hkdf_label_prefix);
      if (iVar16 == 0) {
        lVar34 = sVar39 - sVar28;
        lVar35 = lVar34 + -3;
        ppVar41 = tls->key_schedule;
        if (ppVar41->num_hashes != 0) {
          puVar46 = emitter->buf->base;
          pppVar27 = &ppVar41->hashes[0].ctx;
          sVar39 = 0;
          do {
            (*(*pppVar27)->update)(*pppVar27,puVar46 + lVar24,lVar35 - lVar24);
            sVar39 = sVar39 + 1;
            pppVar27 = pppVar27 + 2;
          } while (sVar39 != ppVar41->num_hashes);
        }
        iVar16 = calc_verify_data(emitter->buf->base + lVar34,tls->key_schedule,local_78);
        bVar45 = iVar16 == 0;
      }
      else {
        bVar45 = false;
      }
      if (!bVar45) goto LAB_001158c4;
    }
    ppVar41 = tls->key_schedule;
    if (ppVar41->num_hashes != 0) {
      puVar46 = emitter->buf->base;
      sVar39 = emitter->buf->off;
      pppVar27 = &ppVar41->hashes[0].ctx;
      sVar28 = 0;
      do {
        (*(*pppVar27)->update)(*pppVar27,puVar46 + lVar35,sVar39 - lVar35);
        sVar28 = sVar28 + 1;
        pppVar27 = pppVar27 + 2;
      } while (sVar28 != ppVar41->num_hashes);
    }
    ppVar41 = local_e8;
    if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) {
      if (local_e8 != (ptls_key_schedule_t *)0x0) {
        __assert_fail("!is_second_flight",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                      ,0x840,
                      "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                     );
      }
      iVar16 = setup_traffic_protection(tls,1,"c e traffic",1,0);
      if ((iVar16 != 0) || (iVar16 = push_change_cipher_spec(tls,emitter), iVar16 != 0))
      goto LAB_001158c4;
    }
    if ((ppVar41 != (ptls_key_schedule_t *)0x0 || local_f8 == (ptls_cipher_suite_t *)0x0) ||
       (iVar16 = derive_exporter_secret(tls,1), iVar16 == 0)) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO - (local_c0 == (ptls_iovec_t *)0x0);
      iVar16 = 0x202;
    }
  }
LAB_001158c4:
  if (local_110 != (char *)0x0) {
    free(local_110);
  }
  (*ptls_clear_memory)(local_78,0x40);
  return iVar16;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    char *published_sni = NULL;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, &published_sni, tls->client_random)) !=
                0) {
                goto Exit;
            }
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    if (published_sni != NULL) {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                            if ((ret = emit_server_name_extension(sendbuf, published_sni)) != 0)
                                goto Exit;
                        });
                    }
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (published_sni != NULL) {
        free(published_sni);
    }
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}